

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* Gudhi::Persistence_representations::create_Gaussian_filter
            (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *__return_storage_ptr__,size_t pixel_radius,double sigma)

{
  size_type __n;
  pointer pvVar1;
  pointer pdVar2;
  pointer pvVar3;
  size_t i;
  int y;
  long lVar4;
  size_t j;
  long lVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  allocator_type local_99;
  double local_98;
  double local_90;
  double local_88;
  long local_80;
  long local_78;
  double local_70;
  double local_68;
  value_type_conflict1 local_60;
  double local_58;
  double dStack_50;
  vector<double,_std::allocator<double>_> v;
  undefined1 auVar9 [16];
  
  local_88 = sigma * sigma;
  __n = pixel_radius * 2 + 1;
  local_98 = sigma;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__n,(allocator_type *)&v);
  lVar6 = 0;
  lVar4 = 0;
  while( true ) {
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (lVar4 == ((long)(__return_storage_ptr__->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) break;
    local_60 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&v,__n,&local_60,&local_99);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((__return_storage_ptr__->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar6),&v);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&v);
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x18;
  }
  local_98 = local_98 + local_98;
  auVar9._8_4_ = (int)(pixel_radius >> 0x20);
  auVar9._0_8_ = pixel_radius;
  auVar9._12_4_ = 0x45300000;
  iVar7 = (int)pixel_radius;
  dStack_50 = auVar9._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0);
  local_70 = local_88 * 3.141592;
  local_90 = 0.0;
  lVar4 = (long)-iVar7;
  local_80 = lVar4;
  while (lVar4 <= iVar7) {
    local_68 = ((double)(int)lVar4 * local_98) / local_58;
    local_68 = local_68 * local_68;
    local_78 = lVar4;
    for (lVar6 = local_80; lVar6 <= iVar7; lVar6 = lVar6 + 1) {
      dVar8 = ((double)(int)lVar6 * local_98) / local_58;
      dVar8 = SQRT(dVar8 * dVar8 + local_68);
      dVar8 = exp((-dVar8 * dVar8) / local_88);
      pvVar3 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(double *)
       (*(long *)&pvVar3[lVar4 + pixel_radius].super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data + pixel_radius * 8 + lVar6 * 8) = dVar8 / local_70
      ;
      local_90 = local_90 + dVar8 / local_70;
    }
    lVar4 = local_78 + 1;
  }
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar4 = 0; lVar4 != ((long)pvVar1 - (long)pvVar3) / 0x18; lVar4 = lVar4 + 1) {
    lVar6 = *(long *)&pvVar3[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    pdVar2 = *(pointer *)
              ((long)&pvVar3[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (lVar5 = 0; (long)pdVar2 - lVar6 >> 3 != lVar5; lVar5 = lVar5 + 1) {
      *(double *)(lVar6 + lVar5 * 8) = *(double *)(lVar6 + lVar5 * 8) / local_90;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double> > create_Gaussian_filter(size_t pixel_radius, double sigma) {
  bool dbg = false;
  // we are computing the kernel mask to 2 standard deviations away from the center. We discretize it in a grid of a
  // size 2*pixel_radius times 2*pixel_radius.

  double r = 0;
  double sigma_sqr = sigma * sigma;

  // sum is for normalization
  double sum = 0;

  // initialization of a kernel:
  std::vector<std::vector<double> > kernel(2 * pixel_radius + 1);
  for (size_t i = 0; i != kernel.size(); ++i) {
    std::vector<double> v(2 * pixel_radius + 1, 0);
    kernel[i] = v;
  }

  if (dbg) {
    std::clog << "Kernel initialize \n";
    std::clog << "pixel_radius : " << pixel_radius << std::endl;
    std::clog << "kernel.size() : " << kernel.size() << std::endl;
    getchar();
  }

  for (int x = -pixel_radius; x <= static_cast<int>(pixel_radius); x++) {
    for (int y = -pixel_radius; y <= static_cast<int>(pixel_radius); y++) {
      double real_x = 2 * sigma * x / pixel_radius;
      double real_y = 2 * sigma * y / pixel_radius;
      r = std::sqrt(real_x * real_x + real_y * real_y);
      kernel[x + pixel_radius][y + pixel_radius] = (exp(-(r * r) / sigma_sqr)) / (3.141592 * sigma_sqr);
      sum += kernel[x + pixel_radius][y + pixel_radius];
    }
  }

  // normalize the kernel
  for (size_t i = 0; i != kernel.size(); ++i) {
    for (size_t j = 0; j != kernel[i].size(); ++j) {
      kernel[i][j] /= sum;
    }
  }

  if (dbg) {
    std::clog << "Here is the kernel : \n";
    for (size_t i = 0; i != kernel.size(); ++i) {
      for (size_t j = 0; j != kernel[i].size(); ++j) {
        std::clog << kernel[i][j] << " ";
      }
      std::clog << std::endl;
    }
  }
  return kernel;
}